

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O1

void hadamard_col8x2_avx2(__m256i *in,int iter)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  auVar1 = vpaddw_avx2((undefined1  [32])in[1],(undefined1  [32])*in);
  auVar8 = vpsubw_avx2((undefined1  [32])*in,(undefined1  [32])in[1]);
  auVar2 = vpaddw_avx2((undefined1  [32])in[3],(undefined1  [32])in[2]);
  auVar9 = vpsubw_avx2((undefined1  [32])in[2],(undefined1  [32])in[3]);
  auVar3 = vpaddw_avx2((undefined1  [32])in[5],(undefined1  [32])in[4]);
  auVar10 = vpsubw_avx2((undefined1  [32])in[4],(undefined1  [32])in[5]);
  auVar4 = vpaddw_avx2((undefined1  [32])in[7],(undefined1  [32])in[6]);
  auVar11 = vpsubw_avx2((undefined1  [32])in[6],(undefined1  [32])in[7]);
  auVar5 = vpaddw_avx2(auVar1,auVar2);
  auVar6 = vpaddw_avx2(auVar9,auVar8);
  auVar12 = vpsubw_avx2(auVar1,auVar2);
  auVar8 = vpsubw_avx2(auVar8,auVar9);
  auVar1 = vpaddw_avx2(auVar3,auVar4);
  auVar2 = vpaddw_avx2(auVar11,auVar10);
  auVar3 = vpsubw_avx2(auVar3,auVar4);
  auVar4 = vpsubw_avx2(auVar10,auVar11);
  alVar7 = (__m256i)vpaddw_avx2(auVar1,auVar5);
  if (iter != 0) {
    *in = alVar7;
    alVar7 = (__m256i)vpaddw_avx2(auVar2,auVar6);
    in[7] = alVar7;
    alVar7 = (__m256i)vpaddw_avx2(auVar3,auVar12);
    in[3] = alVar7;
    alVar7 = (__m256i)vpaddw_avx2(auVar4,auVar8);
    in[4] = alVar7;
    alVar7 = (__m256i)vpsubw_avx2(auVar5,auVar1);
    in[2] = alVar7;
    alVar7 = (__m256i)vpsubw_avx2(auVar6,auVar2);
    in[6] = alVar7;
    alVar7 = (__m256i)vpsubw_avx2(auVar12,auVar3);
    in[1] = alVar7;
    alVar7 = (__m256i)vpsubw_avx2(auVar8,auVar4);
    in[5] = alVar7;
    return;
  }
  auVar9 = vpaddw_avx2(auVar2,auVar6);
  auVar10 = vpaddw_avx2(auVar3,auVar12);
  auVar11 = vpaddw_avx2(auVar4,auVar8);
  auVar1 = vpsubw_avx2(auVar5,auVar1);
  auVar2 = vpsubw_avx2(auVar6,auVar2);
  auVar3 = vpsubw_avx2(auVar12,auVar3);
  auVar4 = vpsubw_avx2(auVar8,auVar4);
  auVar5 = vpunpcklwd_avx2((undefined1  [32])alVar7,auVar3);
  auVar6 = vpunpcklwd_avx2(auVar1,auVar10);
  auVar3 = vpunpckhwd_avx2((undefined1  [32])alVar7,auVar3);
  auVar1 = vpunpckhwd_avx2(auVar1,auVar10);
  auVar8 = vpunpcklwd_avx2(auVar11,auVar4);
  auVar10 = vpunpcklwd_avx2(auVar2,auVar9);
  auVar4 = vpunpckhwd_avx2(auVar11,auVar4);
  auVar2 = vpunpckhwd_avx2(auVar2,auVar9);
  auVar9 = vpunpckldq_avx2(auVar5,auVar6);
  auVar11 = vpunpckldq_avx2(auVar8,auVar10);
  auVar5 = vpunpckhdq_avx2(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx2(auVar8,auVar10);
  auVar8 = vpunpckldq_avx2(auVar3,auVar1);
  auVar10 = vpunpckldq_avx2(auVar4,auVar2);
  auVar1 = vpunpckhdq_avx2(auVar3,auVar1);
  auVar2 = vpunpckhdq_avx2(auVar4,auVar2);
  alVar7 = (__m256i)vpunpcklqdq_avx2(auVar9,auVar11);
  *in = alVar7;
  alVar7 = (__m256i)vpunpckhqdq_avx2(auVar9,auVar11);
  in[1] = alVar7;
  alVar7 = (__m256i)vpunpcklqdq_avx2(auVar5,auVar6);
  in[2] = alVar7;
  alVar7 = (__m256i)vpunpckhqdq_avx2(auVar5,auVar6);
  in[3] = alVar7;
  alVar7 = (__m256i)vpunpcklqdq_avx2(auVar8,auVar10);
  in[4] = alVar7;
  alVar7 = (__m256i)vpunpckhqdq_avx2(auVar8,auVar10);
  in[5] = alVar7;
  alVar7 = (__m256i)vpunpcklqdq_avx2(auVar1,auVar2);
  in[6] = alVar7;
  alVar7 = (__m256i)vpunpckhqdq_avx2(auVar1,auVar2);
  in[7] = alVar7;
  return;
}

Assistant:

static void hadamard_col8x2_avx2(__m256i *in, int iter) {
  __m256i a0 = in[0];
  __m256i a1 = in[1];
  __m256i a2 = in[2];
  __m256i a3 = in[3];
  __m256i a4 = in[4];
  __m256i a5 = in[5];
  __m256i a6 = in[6];
  __m256i a7 = in[7];

  __m256i b0 = _mm256_add_epi16(a0, a1);
  __m256i b1 = _mm256_sub_epi16(a0, a1);
  __m256i b2 = _mm256_add_epi16(a2, a3);
  __m256i b3 = _mm256_sub_epi16(a2, a3);
  __m256i b4 = _mm256_add_epi16(a4, a5);
  __m256i b5 = _mm256_sub_epi16(a4, a5);
  __m256i b6 = _mm256_add_epi16(a6, a7);
  __m256i b7 = _mm256_sub_epi16(a6, a7);

  a0 = _mm256_add_epi16(b0, b2);
  a1 = _mm256_add_epi16(b1, b3);
  a2 = _mm256_sub_epi16(b0, b2);
  a3 = _mm256_sub_epi16(b1, b3);
  a4 = _mm256_add_epi16(b4, b6);
  a5 = _mm256_add_epi16(b5, b7);
  a6 = _mm256_sub_epi16(b4, b6);
  a7 = _mm256_sub_epi16(b5, b7);

  if (iter == 0) {
    b0 = _mm256_add_epi16(a0, a4);
    b7 = _mm256_add_epi16(a1, a5);
    b3 = _mm256_add_epi16(a2, a6);
    b4 = _mm256_add_epi16(a3, a7);
    b2 = _mm256_sub_epi16(a0, a4);
    b6 = _mm256_sub_epi16(a1, a5);
    b1 = _mm256_sub_epi16(a2, a6);
    b5 = _mm256_sub_epi16(a3, a7);

    a0 = _mm256_unpacklo_epi16(b0, b1);
    a1 = _mm256_unpacklo_epi16(b2, b3);
    a2 = _mm256_unpackhi_epi16(b0, b1);
    a3 = _mm256_unpackhi_epi16(b2, b3);
    a4 = _mm256_unpacklo_epi16(b4, b5);
    a5 = _mm256_unpacklo_epi16(b6, b7);
    a6 = _mm256_unpackhi_epi16(b4, b5);
    a7 = _mm256_unpackhi_epi16(b6, b7);

    b0 = _mm256_unpacklo_epi32(a0, a1);
    b1 = _mm256_unpacklo_epi32(a4, a5);
    b2 = _mm256_unpackhi_epi32(a0, a1);
    b3 = _mm256_unpackhi_epi32(a4, a5);
    b4 = _mm256_unpacklo_epi32(a2, a3);
    b5 = _mm256_unpacklo_epi32(a6, a7);
    b6 = _mm256_unpackhi_epi32(a2, a3);
    b7 = _mm256_unpackhi_epi32(a6, a7);

    in[0] = _mm256_unpacklo_epi64(b0, b1);
    in[1] = _mm256_unpackhi_epi64(b0, b1);
    in[2] = _mm256_unpacklo_epi64(b2, b3);
    in[3] = _mm256_unpackhi_epi64(b2, b3);
    in[4] = _mm256_unpacklo_epi64(b4, b5);
    in[5] = _mm256_unpackhi_epi64(b4, b5);
    in[6] = _mm256_unpacklo_epi64(b6, b7);
    in[7] = _mm256_unpackhi_epi64(b6, b7);
  } else {
    in[0] = _mm256_add_epi16(a0, a4);
    in[7] = _mm256_add_epi16(a1, a5);
    in[3] = _mm256_add_epi16(a2, a6);
    in[4] = _mm256_add_epi16(a3, a7);
    in[2] = _mm256_sub_epi16(a0, a4);
    in[6] = _mm256_sub_epi16(a1, a5);
    in[1] = _mm256_sub_epi16(a2, a6);
    in[5] = _mm256_sub_epi16(a3, a7);
  }
}